

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_substring.c
# Opt level: O1

int coda_pcre2_substring_get_byname_8
              (pcre2_match_data_8 *match_data,PCRE2_SPTR8 stringname,PCRE2_UCHAR8 **stringptr,
              size_t *sizeptr)

{
  bool bVar1;
  uint uVar2;
  ushort uVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  ushort *puVar7;
  PCRE2_SPTR8 last;
  PCRE2_SPTR8 first;
  ushort *local_40;
  ushort *local_38;
  
  uVar6 = 0xffffffd7;
  if ((match_data->matchedby != '\x01') &&
     (uVar2 = coda_pcre2_substring_nametable_scan_8
                        (match_data->code,stringname,(PCRE2_SPTR8 *)&local_38,
                         (PCRE2_SPTR8 *)&local_40), uVar6 = uVar2, -1 < (int)uVar2)) {
    uVar5 = 0xffffffca;
    uVar6 = 0xffffffca;
    if (local_38 <= local_40) {
      uVar4 = (ulong)uVar2;
      puVar7 = local_38;
      do {
        uVar3 = *puVar7 << 8 | *puVar7 >> 8;
        bVar1 = true;
        if (uVar3 < match_data->oveccount) {
          if (match_data->ovector[(ulong)uVar3 * 2] == 0xffffffffffffffff) {
            uVar5 = 0xffffffc9;
          }
          else {
            uVar2 = coda_pcre2_substring_get_bynumber_8(match_data,(uint)uVar3,stringptr,sizeptr);
            bVar1 = false;
          }
        }
        uVar6 = uVar2;
      } while ((bVar1) &&
              (puVar7 = (ushort *)((long)puVar7 + uVar4), uVar6 = uVar5, puVar7 <= local_40));
    }
  }
  return uVar6;
}

Assistant:

PCRE2_CALL_CONVENTION
pcre2_substring_get_byname(pcre2_match_data *match_data,
  PCRE2_SPTR stringname, PCRE2_UCHAR **stringptr, PCRE2_SIZE *sizeptr)
{
PCRE2_SPTR first, last, entry;
int failrc, entrysize;
if (match_data->matchedby == PCRE2_MATCHEDBY_DFA_INTERPRETER)
  return PCRE2_ERROR_DFA_UFUNC;
entrysize = pcre2_substring_nametable_scan(match_data->code, stringname,
  &first, &last);
if (entrysize < 0) return entrysize;
failrc = PCRE2_ERROR_UNAVAILABLE;
for (entry = first; entry <= last; entry += entrysize)
  {
  uint32_t n = GET2(entry, 0);
  if (n < match_data->oveccount)
    {
    if (match_data->ovector[n*2] != PCRE2_UNSET)
      return pcre2_substring_get_bynumber(match_data, n, stringptr, sizeptr);
    failrc = PCRE2_ERROR_UNSET;
    }
  }
return failrc;
}